

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCatchExpr
          (ExprVisitorDelegate *this,TryExpr *expr,Catch *catch_)

{
  int *piVar1;
  WatWriter *pWVar2;
  bool bVar3;
  char *pcVar4;
  
  Dedent(this->writer_);
  bVar3 = Catch::IsCatchAll(catch_);
  pWVar2 = this->writer_;
  if (bVar3) {
    pcVar4 = Opcode::GetName((Opcode *)&Opcode::CatchAll_Opcode);
    WritePutsNewline(pWVar2,pcVar4);
  }
  else {
    pcVar4 = Opcode::GetName((Opcode *)&Opcode::Catch_Opcode);
    WritePutsSpace(pWVar2,pcVar4);
    WriteVar(this->writer_,&catch_->var,Newline);
  }
  pWVar2 = this->writer_;
  piVar1 = &pWVar2->indent_;
  *piVar1 = *piVar1 + 2;
  (pWVar2->super_ModuleContext).label_stack_.
  super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.super__Vector_impl_data.
  _M_finish[-1].label_type = Catch;
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCatchExpr(TryExpr* expr,
                                                   Catch* catch_) {
  writer_->Dedent();
  if (catch_->IsCatchAll()) {
    writer_->WritePutsNewline(Opcode::CatchAll_Opcode.GetName());
  } else {
    writer_->WritePutsSpace(Opcode::Catch_Opcode.GetName());
    writer_->WriteVar(catch_->var, NextChar::Newline);
  }
  writer_->Indent();
  writer_->SetTopLabelType(LabelType::Catch);
  return Result::Ok;
}